

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void Curl_freeset(Curl_easy *data)

{
  undefined1 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    (*Curl_cfree)((data->set).str[lVar2]);
    (data->set).str[lVar2] = (char *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x4f);
  lVar2 = 0;
  do {
    (*Curl_cfree)((data->set).blobs[lVar2]);
    (data->set).blobs[lVar2] = (curl_blob *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  if (((data->state).field_0x6d2 & 4) != 0) {
    (*Curl_cfree)((data->state).referer);
    (data->state).referer = (char *)0x0;
    puVar1 = &(data->state).field_0x6d2;
    *puVar1 = *puVar1 & 0xfb;
  }
  (data->state).referer = (char *)0x0;
  if (((data->state).field_0x6d2 & 2) != 0) {
    (*Curl_cfree)((data->state).url);
    (data->state).url = (char *)0x0;
    puVar1 = &(data->state).field_0x6d2;
    *puVar1 = *puVar1 & 0xfd;
  }
  (data->state).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  enum dupblob j;

  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  for(j = (enum dupblob)0; j < BLOB_LAST; j++) {
    Curl_safefree(data->set.blobs[j]);
  }

  if(data->state.referer_alloc) {
    Curl_safefree(data->state.referer);
    data->state.referer_alloc = FALSE;
  }
  data->state.referer = NULL;
  if(data->state.url_alloc) {
    Curl_safefree(data->state.url);
    data->state.url_alloc = FALSE;
  }
  data->state.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}